

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,2>,tcu::Vector<float,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  FloatFormat *fmt;
  ResultCollector *pRVar1;
  pointer pVVar2;
  Variable<tcu::Vector<float,_2>_> *pVVar3;
  pointer pcVar4;
  PrecisionCase *pPVar5;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  *pVVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  ContextType type;
  int iVar10;
  uint uVar11;
  _Rb_tree_node_base *p_Var12;
  char *__s;
  size_t sVar13;
  long *plVar14;
  ShaderExecutor *pSVar15;
  IVal *pIVar16;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  Vector<float,_2> *val;
  PrecisionCase *pPVar18;
  long lVar19;
  size_t size;
  ulong uVar20;
  IVal in2;
  IVal in1;
  IVal in3;
  FuncSet funcs;
  ostringstream os;
  FloatFormat highpFmt;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  PrecisionCase *local_518;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  *local_510;
  undefined1 local_508 [8];
  size_type local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  undefined1 local_4e8 [48];
  Statement *local_4b8;
  ResultCollector *local_4b0;
  string local_4a8;
  ulong local_488;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_480;
  undefined1 local_478 [8];
  undefined8 uStack_470;
  _Base_ptr p_Stack_468;
  _Rb_tree_node_base *local_460;
  _Base_ptr local_458;
  anon_struct_8_2_bfd9d0cb_for_basic aStack_450;
  size_t local_440;
  undefined1 local_438 [8];
  double dStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_428;
  _Base_ptr local_418;
  Data DStack_410;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  FloatFormat local_2b8;
  ulong local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_280;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [32];
  _Base_ptr local_188;
  anon_struct_8_2_bfd9d0cb_for_basic aStack_180;
  ios_base local_138 [264];
  
  local_4b0 = (ResultCollector *)
              (inputs->in0).
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (ResultCollector *)
           (inputs->in0).
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  size = (long)pRVar1 - (long)local_4b0 >> 3;
  local_4b8 = stmt;
  local_480 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_2>,_tcu::Vector<float,_2>_>_>
  ::Outputs(&local_250,size);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_2b8.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_280._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_impl.super__Rb_tree_header._M_header;
  local_280._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_280._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_280._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"Statement: ",0xb);
  (*local_4b8->_vptr_Statement[2])(local_4b8,(ostringstream *)&dStack_430);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_518 = this;
  local_510 = variables;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uStack_470 = (double)((ulong)uStack_470._4_4_ << 0x20);
  p_Stack_468 = (_Base_ptr)0x0;
  aStack_450 = (anon_struct_8_2_bfd9d0cb_for_basic)0x0;
  local_460 = (_Rb_tree_node_base *)&uStack_470;
  local_458 = (_Rb_tree_node_base *)&uStack_470;
  (*local_4b8->_vptr_Statement[4])(local_4b8,local_478);
  if (local_460 != (_Rb_tree_node_base *)&uStack_470) {
    p_Var12 = local_460;
    do {
      (**(code **)(**(long **)(p_Var12 + 1) + 0x30))(*(long **)(p_Var12 + 1),local_1a8);
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != (_Rb_tree_node_base *)&uStack_470);
  }
  pPVar18 = local_518;
  if (aStack_450 != (anon_struct_8_2_bfd9d0cb_for_basic)0x0) {
    local_438 = (undefined1  [8])((local_518->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_430,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_430,(char *)local_4e8._0_8_,local_4e8._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_4e8._0_8_ != (IVal *)(local_4e8 + 0x10)) {
      operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_478);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,"precision ",10);
  __s = glu::getPrecisionName((pPVar18->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)((long)&local_518 + *(long *)((long)local_438 + -0x18)) + 0xe0);
  }
  else {
    sVar13 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438,__s,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_438," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar4 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar4) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_518->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_518->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_518->m_extension);
    plVar14 = (long *)std::__cxx11::string::append(local_1a8);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar17) {
      aStack_428._M_allocated_capacity = paVar17->_M_allocated_capacity;
      aStack_428._8_8_ = plVar14[3];
      local_438 = (undefined1  [8])&aStack_428;
    }
    else {
      aStack_428._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_438 = (undefined1  [8])*plVar14;
    }
    dStack_430 = (double)plVar14[1];
    *plVar14 = (long)paVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_438);
    if (local_438 != (undefined1  [8])&aStack_428) {
      operator_delete((void *)local_438,aStack_428._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar4) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,local_518,
             (local_510->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar7 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar7 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&aStack_428) {
    operator_delete((void *)local_438,aStack_428._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,local_518,
             (local_510->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar7 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_438);
  glu::VarType::operator=(&((pointer)(uVar7 + 0x38))->varType,(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&aStack_428) {
    operator_delete((void *)local_438,aStack_428._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,2>>
            ((Symbol *)local_438,local_518,
             (local_510->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr);
  uVar7 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_438);
  glu::VarType::operator=((VarType *)(uVar7 + 0x20),(VarType *)&local_418);
  glu::VarType::~VarType((VarType *)&local_418);
  if (local_438 != (undefined1  [8])&aStack_428) {
    operator_delete((void *)local_438,aStack_428._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
  (*local_4b8->_vptr_Statement[2])(local_4b8,local_438);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
  std::ios_base::~ios_base(local_3c8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar4) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar18 = local_518;
  pSVar15 = ShaderExecUtil::createExecutor
                      ((local_518->m_ctx).renderContext,(local_518->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  pVVar6 = local_510;
  local_438 = (undefined1  [8])
              (local_480->in0).
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  dStack_430 = (double)(local_480->in1).
                       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  aStack_428._M_allocated_capacity =
       (size_type)
       (local_480->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  aStack_428._8_8_ =
       (local_480->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*pSVar15->_vptr_ShaderExecutor[3])
            (pSVar15,((pPVar18->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar10 = (*pSVar15->_vptr_ShaderExecutor[2])(pSVar15);
  if ((char)iVar10 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar15->_vptr_ShaderExecutor[5])(pSVar15);
  (*pSVar15->_vptr_ShaderExecutor[6])(pSVar15,size & 0xffffffff,local_438,local_1a8);
  (*pSVar15->_vptr_ShaderExecutor[1])(pSVar15);
  local_438 = (undefined1  [8])((ulong)local_438 & 0xffffffffffffff00);
  dStack_430 = INFINITY;
  aStack_428._M_allocated_capacity = 0xfff0000000000000;
  aStack_428._8_8_ = aStack_428._8_8_ & 0xffffffffffffff00;
  local_418 = (_Base_ptr)0x7ff0000000000000;
  DStack_410.basic.type = TYPE_INVALID;
  DStack_410.basic.precision = 0xfff00000;
  local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
  local_1a8._8_8_ = INFINITY;
  local_1a8._16_8_ = (_Base_ptr)0xfff0000000000000;
  local_1a8._24_8_ = local_1a8._24_8_ & 0xffffffffffffff00;
  local_188 = (_Base_ptr)0x7ff0000000000000;
  aStack_180.type = TYPE_INVALID;
  aStack_180.precision = 0xfff00000;
  local_478 = (undefined1  [8])((ulong)local_478 & 0xffffffffffffff00);
  uStack_470 = INFINITY;
  p_Stack_468 = (_Base_ptr)0xfff0000000000000;
  local_460 = (_Rb_tree_node_base *)((ulong)local_460 & 0xffffffffffffff00);
  local_458 = (_Base_ptr)0x7ff0000000000000;
  aStack_450.type = TYPE_INVALID;
  aStack_450.precision = 0xfff00000;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_280,
             (pVVar6->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_438);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar6->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_4e8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar6->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_508);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_280,
             (pVVar6->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_4a8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_280,
             (pVVar6->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_280,
             (pVVar6->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
             .m_ptr,(IVal *)local_478);
  if (pRVar1 == local_4b0) {
LAB_006e3870:
    local_438 = (undefined1  [8])((pPVar18->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    fmt = &(pPVar18->m_ctx).floatFormat;
    local_4b0 = &pPVar18->m_status;
    local_288 = size + (size == 0);
    lVar19 = 0;
    uVar20 = 0;
    local_488 = 0;
    local_440 = size;
    do {
      local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
      local_1a8._8_8_ = INFINITY;
      local_1a8._16_8_ = 0xfff0000000000000;
      local_1a8._24_8_ = local_1a8._24_8_ & 0xffffffffffffff00;
      local_188 = (_Base_ptr)0x7ff0000000000000;
      aStack_180 = (anon_struct_8_2_bfd9d0cb_for_basic)0xfff0000000000000;
      local_478 = (undefined1  [8])((ulong)local_478 & 0xffffffffffffff00);
      uStack_470 = INFINITY;
      p_Stack_468 = (_Base_ptr)0xfff0000000000000;
      local_460 = (_Rb_tree_node_base *)((ulong)local_460 & 0xffffffffffffff00);
      local_458 = (_Base_ptr)0x7ff0000000000000;
      aStack_450 = (anon_struct_8_2_bfd9d0cb_for_basic)0xfff0000000000000;
      if ((uVar20 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_518->super_TestCase).super_TestNode.m_testCtx);
      }
      pVVar2 = (local_480->in0).
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_508._0_4_ = pVVar2[uVar20].m_data[0];
      local_508._4_4_ = pVVar2[uVar20].m_data[1];
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                ((IVal *)local_4e8,fmt,(Vector<float,_2> *)local_508);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,fmt,(IVal *)local_4e8);
      pIVar16 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_280,
                           (local_510->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pVVar6 = local_510;
      pIVar16->m_data[1].m_lo = (double)local_418;
      pIVar16->m_data[1].m_hi = (double)DStack_410.basic;
      pIVar16->m_data[0].m_hi = (double)aStack_428._M_allocated_capacity;
      *(undefined8 *)(pIVar16->m_data + 1) = aStack_428._8_8_;
      pIVar16->m_data[0].m_hasNaN = local_438;
      pIVar16->m_data[0].m_lo = dStack_430;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (local_510->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar6->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_280,
                 (pVVar6->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_418 = (_Base_ptr)(pPVar18->m_ctx).floatFormat.m_maxValue;
      local_438 = *(undefined1 (*) [8])fmt;
      dStack_430 = *(double *)&(pPVar18->m_ctx).floatFormat.m_fractionBits;
      aStack_428._M_allocated_capacity = *(undefined8 *)&(pPVar18->m_ctx).floatFormat.m_hasInf;
      aStack_428._8_8_ = *(undefined8 *)&(pPVar18->m_ctx).floatFormat.m_exactPrecision;
      DStack_410.basic.type = (local_518->m_ctx).precision;
      local_400 = 0;
      DStack_410._8_8_ = &local_280;
      (*local_4b8->_vptr_Statement[3])(local_4b8,(MessageBuilder *)local_438);
      pIVar16 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_280,
                           (local_510->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,&local_2b8,pIVar16);
      local_458 = local_418;
      aStack_450 = DStack_410.basic;
      p_Stack_468 = (_Base_ptr)aStack_428._M_allocated_capacity;
      local_460 = (_Rb_tree_node_base *)aStack_428._8_8_;
      local_478 = local_438;
      uStack_470 = dStack_430;
      bVar8 = contains<tcu::Vector<float,2>>
                        ((IVal *)local_478,
                         (Vector<float,_2> *)
                         ((long)(local_250.out1.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar19));
      local_438 = (undefined1  [8])&aStack_428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 1 is outside acceptable range","");
      bVar8 = tcu::ResultCollector::check(local_4b0,bVar8,(string *)local_438);
      if (local_438 != (undefined1  [8])&aStack_428) {
        operator_delete((void *)local_438,(ulong)(aStack_428._M_allocated_capacity + 1));
      }
      pIVar16 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_280,
                           (local_510->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,&local_2b8,pIVar16);
      local_188 = local_418;
      aStack_180 = DStack_410.basic;
      local_1a8._16_8_ = aStack_428._M_allocated_capacity;
      local_1a8._24_8_ = aStack_428._8_8_;
      local_1a8._0_8_ = local_438;
      local_1a8._8_8_ = dStack_430;
      bVar9 = contains<tcu::Vector<float,2>>
                        ((IVal *)local_1a8,
                         (Vector<float,_2> *)
                         ((long)(local_250.out0.
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar19));
      local_438 = (undefined1  [8])&aStack_428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar9 = tcu::ResultCollector::check(local_4b0,bVar9,(string *)local_438);
      if (local_438 != (undefined1  [8])&aStack_428) {
        operator_delete((void *)local_438,(ulong)(aStack_428._M_allocated_capacity + 1));
      }
      if (!bVar8 || !bVar9) {
        uVar11 = (int)local_488 + 1;
        local_488 = (ulong)uVar11;
        if ((int)uVar11 < 0x65) {
          local_438 = (undefined1  [8])((local_518->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar3 = (local_510->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                   .m_ptr;
          val = (Vector<float,_2> *)(local_4e8 + 0x10);
          pcVar4 = (pVVar3->m_name)._M_dataplus._M_p;
          local_4e8._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4e8,pcVar4,pcVar4 + (pVVar3->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)local_4e8._0_8_,local_4e8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_508,(BuiltinPrecisionTests *)&local_2b8,
                     (FloatFormat *)
                     ((long)((local_480->in0).
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar19),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT44(local_508._4_4_,local_508._0_4_),
                     local_500);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_508._4_4_,local_508._0_4_) != &local_4f8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_508._4_4_,local_508._0_4_),
                            local_4f8._M_allocated_capacity + 1);
          }
          if ((Vector<float,_2> *)local_4e8._0_8_ != (Vector<float,_2> *)(local_4e8 + 0x10)) {
            operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar3 = (local_510->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                   .m_ptr;
          pIVar16 = (IVal *)(local_4e8 + 0x10);
          pcVar4 = (pVVar3->m_name)._M_dataplus._M_p;
          local_4e8._0_8_ = pIVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4e8,pcVar4,pcVar4 + (pVVar3->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)local_4e8._0_8_,local_4e8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_508,(BuiltinPrecisionTests *)&local_2b8,
                     (FloatFormat *)
                     ((long)(local_250.out0.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar19),
                     (Vector<float,_2> *)pIVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT44(local_508._4_4_,local_508._0_4_),
                     local_500);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,2>>
                    (&local_4a8,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_1a8,pIVar16
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_508._4_4_,local_508._0_4_) != &local_4f8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_508._4_4_,local_508._0_4_),
                            local_4f8._M_allocated_capacity + 1);
          }
          if ((IVal *)local_4e8._0_8_ != (IVal *)(local_4e8 + 0x10)) {
            operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\t",1);
          pVVar3 = (local_510->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                   .m_ptr;
          pIVar16 = (IVal *)(local_4e8 + 0x10);
          pcVar4 = (pVVar3->m_name)._M_dataplus._M_p;
          local_4e8._0_8_ = pIVar16;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4e8,pcVar4,pcVar4 + (pVVar3->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)local_4e8._0_8_,local_4e8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," = ",3);
          valueToString<tcu::Vector<float,2>>
                    ((string *)local_508,(BuiltinPrecisionTests *)&local_2b8,
                     (FloatFormat *)
                     ((long)(local_250.out1.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar19),
                     (Vector<float,_2> *)pIVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,(char *)CONCAT44(local_508._4_4_,local_508._0_4_),
                     local_500);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,2>>
                    (&local_4a8,(BuiltinPrecisionTests *)&local_2b8,(FloatFormat *)local_478,pIVar16
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&dStack_430,local_4a8._M_dataplus._M_p,local_4a8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            operator_delete(local_4a8._M_dataplus._M_p,local_4a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_508._4_4_,local_508._0_4_) != &local_4f8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_508._4_4_,local_508._0_4_),
                            local_4f8._M_allocated_capacity + 1);
          }
          if ((IVal *)local_4e8._0_8_ != (IVal *)(local_4e8 + 0x10)) {
            operator_delete((void *)local_4e8._0_8_,local_4e8._16_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
          std::ios_base::~ios_base(local_3c0);
        }
      }
      pPVar5 = local_518;
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 8;
    } while (local_288 != uVar20);
    iVar10 = (int)local_488;
    if (iVar10 < 0x65) {
      pPVar18 = local_518;
      if (iVar10 == 0) goto LAB_006e3870;
    }
    else {
      local_438 = (undefined1  [8])((local_518->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_430,iVar10 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
      std::ios_base::~ios_base(local_3c0);
    }
    local_438 = (undefined1  [8])((pPVar5->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_430);
    std::ostream::operator<<((ostringstream *)&dStack_430,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_430);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_430," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_430);
  std::ios_base::~ios_base(local_3c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}